

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void PreVisitCatch(ParseNodeCatch *pnodeCatch,ByteCodeGenerator *byteCodeGenerator)

{
  ParseNode *this;
  Symbol *this_00;
  IdentPtr pIVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodeParamPattern *pPVar4;
  ParseNodeName *pPVar5;
  undefined4 *puVar6;
  char16 *pcVar7;
  anon_class_8_1_ae4198de handler;
  
  handler.byteCodeGenerator = (ByteCodeGenerator **)pnodeCatch;
  ByteCodeGenerator::StartBindCatch(byteCodeGenerator,(ParseNode *)pnodeCatch);
  this = pnodeCatch->pnodeParam;
  if (this != (ParseNode *)0x0) {
    if (this->nop == knopParamPattern) {
      pPVar4 = ParseNode::AsParseNodeParamPattern(this);
      Parser::MapBindIdentifier<PreVisitCatch(ParseNodeCatch*,ByteCodeGenerator*)::__0>
                ((pPVar4->super_ParseNodeUni).pnode1,handler);
    }
    else {
      pPVar5 = ParseNode::AsParseNodeName(this);
      this_00 = *pPVar5->symRef;
      if (this_00->scope != pnodeCatch->scope) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xe83,"(sym->GetScope() == pnodeCatch->scope)",
                           "sym->GetScope() == pnodeCatch->scope");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ByteCodePhase);
      if (bVar3) {
        pIVar1 = pPVar5->pid;
        pcVar7 = Symbol::GetSymbolTypeName(this_00);
        Output::Print(L"current context has declared catch var %s of type %s\n",&pIVar1->field_0x22,
                      pcVar7);
      }
      this_00->field_0x42 = this_00->field_0x42 | 0x40;
      pPVar5->sym = this_00;
    }
  }
  AddFunctionsToScope(pnodeCatch->pnodeScopes,byteCodeGenerator);
  return;
}

Assistant:

void PreVisitCatch(ParseNodeCatch *pnodeCatch, ByteCodeGenerator *byteCodeGenerator)
{
    // Push the catch scope and add the catch expression to it.
    byteCodeGenerator->StartBindCatch(pnodeCatch);
    
    if (pnodeCatch->HasPatternParam())
    {
        ParseNodeParamPattern * pnodeParamPattern = pnodeCatch->GetParam()->AsParseNodeParamPattern();
        Parser::MapBindIdentifier(pnodeParamPattern->pnode1, [&](ParseNodePtr item)
        {
            Symbol *sym = item->AsParseNodeVar()->sym;
#if DBG_DUMP
            if (byteCodeGenerator->Trace())
            {
                Output::Print(_u("current context has declared catch var %s of type %s\n"),
                    item->AsParseNodeVar()->pid->Psz(), sym->GetSymbolTypeName());
            }
#endif
            sym->SetIsCatch(true);
            sym->SetIsBlockVar(true);
        });
    }
    else if (pnodeCatch->HasParam())
    {
        ParseNodeName * pnodeName = pnodeCatch->GetParam()->AsParseNodeName();
        Symbol *sym = *pnodeName->GetSymRef();
        Assert(sym->GetScope() == pnodeCatch->scope);
#if DBG_DUMP
        if (byteCodeGenerator->Trace())
        {
            Output::Print(_u("current context has declared catch var %s of type %s\n"),
                pnodeName->pid->Psz(), sym->GetSymbolTypeName());
        }
#endif
        sym->SetIsCatch(true);
        pnodeName->sym = sym;
    }
    
    // This call will actually add the nested function symbols to the enclosing function scope (which is what we want).
    AddFunctionsToScope(pnodeCatch->pnodeScopes, byteCodeGenerator);
}